

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

void Llb_NonlinReorder(DdManager *dd,int fTwice,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int level;
  DdManager *pDVar5;
  long lVar6;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  if (fVerbose == 0) {
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
  }
  else {
    uVar2 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar3 = Cudd_ReadDead(dd);
    Abc_Print((int)pDVar5,"Reordering... Before =%5d. ",(ulong)(uVar2 - uVar3));
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    uVar2 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar3 = Cudd_ReadDead(dd);
    Abc_Print((int)pDVar5,"After =%5d. ",(ulong)(uVar2 - uVar3));
  }
  if (fTwice != 0) {
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    if (fVerbose == 0) {
      return;
    }
    uVar2 = Cudd_ReadKeys(dd);
    uVar3 = Cudd_ReadDead(dd);
    Abc_Print((int)dd,"After =%5d. ",(ulong)(uVar2 - uVar3));
  }
  if (fVerbose != 0) {
    level = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  }
  return;
}

Assistant:

void Llb_NonlinReorder( DdManager * dd, int fTwice, int fVerbose )
{
    abctime clk = Abc_Clock();
    if ( fVerbose )
        Abc_Print( 1, "Reordering... Before =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
        Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    if ( fTwice )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose )
            Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}